

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# patch_eval_simd.h
# Opt level: O1

vboolf_impl<4> __thiscall
embree::sse2::
PatchEvalSimd<embree::vboolf_impl<4>,_embree::vint_impl<4>,_embree::vfloat_impl<4>,_embree::vfloat_impl<4>,_embree::vfloat_impl<4>_>
::eval_general(PatchEvalSimd<embree::vboolf_impl<4>,_embree::vint_impl<4>,_embree::vfloat_impl<4>,_embree::vfloat_impl<4>,_embree::vfloat_impl<4>_>
               *this,vboolf_impl<4> *valid,SubdividedGeneralPatch *patch,vfloat_impl<4> *U,
              vfloat_impl<4> *V,size_t depth)

{
  int iVar1;
  long lVar2;
  undefined4 extraout_EAX;
  uint uVar3;
  undefined8 extraout_RDX;
  float fVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  float fVar12;
  float fVar13;
  float *pfVar11;
  float fVar14;
  float fVar15;
  float fVar17;
  float fVar18;
  float *pfVar16;
  int iVar19;
  int iVar20;
  int iVar21;
  int iVar22;
  undefined1 auVar23 [16];
  vboolf_impl<4> vVar24;
  vint_impl<4> i;
  vfloat_impl<4> v;
  vfloat_impl<4> u;
  vboolf_impl<4> valid2;
  int local_88 [4];
  float local_78;
  float fStack_74;
  float fStack_70;
  float fStack_6c;
  anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 local_68;
  undefined1 local_58 [16];
  float *local_48;
  float *pfStack_40;
  undefined8 uVar4;
  
  uVar4 = mm_lookupmask_ps._8_8_;
  this->P = (float *)mm_lookupmask_ps._0_8_;
  this->dPdu = (float *)uVar4;
  fVar5 = (V->field_0).v[0] * 0.5;
  fVar12 = (V->field_0).v[1] * 0.5;
  fVar14 = (V->field_0).v[2] * 0.5;
  fVar17 = (V->field_0).v[3] * 0.5;
  fVar6 = floorf(fVar14);
  fVar7 = floorf(fVar17);
  fVar8 = floorf(fVar5);
  fVar9 = floorf(fVar12);
  fVar5 = fVar5 - fVar8;
  fVar12 = fVar12 - fVar9;
  fVar14 = fVar14 - fVar6;
  fVar17 = fVar17 - fVar7;
  local_68.v[0] = fVar5 + fVar5 + -0.5;
  local_68.v[1] = fVar12 + fVar12 + -0.5;
  local_68.v[2] = fVar14 + fVar14 + -0.5;
  local_68.v[3] = fVar17 + fVar17 + -0.5;
  fVar5 = *(float *)depth;
  fVar13 = *(float *)(depth + 4) * 0.5;
  fVar15 = *(float *)(depth + 8) * 0.5;
  fVar18 = *(float *)(depth + 0xc) * 0.5;
  fVar12 = floorf(fVar15);
  fVar14 = floorf(fVar18);
  fVar17 = floorf(fVar5 * 0.5);
  fVar10 = floorf(fVar13);
  fVar5 = fVar5 * 0.5 - fVar17;
  fVar13 = fVar13 - fVar10;
  fVar15 = fVar15 - fVar12;
  fVar18 = fVar18 - fVar14;
  local_78 = fVar5 + fVar5 + -0.5;
  fStack_74 = fVar13 + fVar13 + -0.5;
  fStack_70 = fVar15 + fVar15 + -0.5;
  fStack_6c = fVar18 + fVar18 + -0.5;
  iVar19 = (int)fVar17 * 4 + (int)fVar8;
  iVar20 = (int)fVar10 * 4 + (int)fVar9;
  iVar21 = (int)fVar12 * 4 + (int)fVar6;
  iVar22 = (int)fVar14 * 4 + (int)fVar7;
  local_88[0] = iVar19;
  local_88[1] = iVar20;
  local_88[2] = iVar21;
  local_88[3] = iVar22;
  auVar23._0_4_ = patch->N;
  auVar23._4_4_ = *(undefined4 *)&patch->field_0x4;
  auVar23._8_8_ = patch->child[0];
  pfVar11 = this->P;
  pfVar16 = this->dPdu;
  uVar3 = movmskps(extraout_EAX,auVar23);
  uVar4 = extraout_RDX;
  if (uVar3 != 0) {
    do {
      lVar2 = 0;
      if ((uVar3 & 0xf) != 0) {
        for (; ((uVar3 & 0xf) >> lVar2 & 1) == 0; lVar2 = lVar2 + 1) {
        }
      }
      iVar1 = local_88[(int)lVar2];
      local_58._0_4_ = -(uint)(iVar1 == iVar19);
      local_58._4_4_ = -(uint)(iVar1 == iVar20);
      local_58._8_4_ = -(uint)(iVar1 == iVar21);
      local_58._12_4_ = -(uint)(iVar1 == iVar22);
      local_58 = local_58 & auVar23;
      auVar23 = auVar23 ^ local_58;
      vVar24 = eval((PatchEvalSimd<embree::vboolf_impl<4>,_embree::vint_impl<4>,_embree::vfloat_impl<4>,_embree::vfloat_impl<4>,_embree::vfloat_impl<4>_>
                     *)&local_48,valid,(Ref)local_58,
                    *(vfloat_impl<4> **)((long)&U->field_0 + (long)iVar1 * 8 + 8),
                    (vfloat_impl<4> *)&local_68,1.0,(size_t)&local_78);
      uVar4 = vVar24.field_0._8_8_;
      pfVar11 = (float *)((ulong)pfVar11 | (ulong)local_48);
      pfVar16 = (float *)((ulong)pfVar16 | (ulong)pfStack_40);
      uVar3 = movmskps(vVar24.field_0._0_4_,auVar23);
    } while (uVar3 != 0);
  }
  this->P = pfVar11;
  this->dPdu = pfVar16;
  vVar24.field_0._8_8_ = uVar4;
  vVar24.field_0._0_8_ = this;
  return (vboolf_impl<4>)vVar24.field_0;
}

Assistant:

vbool eval_general(const vbool& valid, const typename Patch::SubdividedGeneralPatch* patch, const vfloat& U, const vfloat& V, const size_t depth)
        {
          vbool ret = false;
          const vint l = (vint)floor(0.5f*U); const vfloat u = 2.0f*frac(0.5f*U)-0.5f; 
          const vint h = (vint)floor(0.5f*V); const vfloat v = 2.0f*frac(0.5f*V)-0.5f; 
          const vint i = (h<<2)+l; assert(all(valid,i<patch->N));
          foreach_unique(valid,i,[&](const vbool& valid, const int i) {
              ret |= eval(valid,patch->child[i],u,v,1.0f,depth+1);
            });
          return ret;
        }